

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O0

GridHandle<pbrt::NanoVDBBuffer> *
pbrt::readGrid<pbrt::NanoVDBBuffer>(string *filename,string *gridName,FileLoc *loc,Allocator alloc)

{
  undefined1 uVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  GridHandle<pbrt::NanoVDBBuffer> *in_RDI;
  Allocator in_R8;
  exception *e;
  NanoVDBBuffer buf;
  GridHandle<pbrt::NanoVDBBuffer> *grid;
  NanoVDBBuffer *in_stack_00000210;
  int in_stack_0000021c;
  string *in_stack_00000220;
  string *in_stack_00000228;
  GridHandle<pbrt::NanoVDBBuffer> *in_stack_fffffffffffffef8;
  GridHandle<pbrt::NanoVDBBuffer> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  GridHandle<pbrt::NanoVDBBuffer> *file;
  NanoVDBBuffer *this;
  LogLevel level;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  NanoVDBBuffer local_40 [2];
  
  this = local_40;
  file = in_RDI;
  NanoVDBBuffer::NanoVDBBuffer(this,in_R8);
  level = (LogLevel)((ulong)this >> 0x20);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle(in_stack_ffffffffffffff00);
  nanovdb::io::readGrid<pbrt::NanoVDBBuffer>
            (in_stack_00000228,in_stack_00000220,in_stack_0000021c,in_stack_00000210);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::operator=
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle(in_stack_ffffffffffffff00);
  uVar1 = nanovdb::GridHandleBase::operator_cast_to_bool((GridHandleBase *)0x659604);
  if ((bool)uVar1) {
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nanovdb::GridHandleBase::gridMetaData((GridHandleBase *)0x659621);
    bVar2 = nanovdb::GridMetaData::isFogVolume((GridMetaData *)0x659632);
    if (!bVar2) {
      nanovdb::GridHandleBase::gridMetaData((GridHandleBase *)0x65964c);
      bVar2 = nanovdb::GridMetaData::isUnknown((GridMetaData *)0x65965d);
      if (!bVar2) {
        ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                  ((FileLoc *)in_RDI,in_stack_ffffffffffffff48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar1,in_stack_ffffffffffffff40),args_1);
      }
    }
    if (LOGGING_LogLevel < 1) {
      nanovdb::GridHandleBase::gridMetaData((GridHandleBase *)0x6596d0);
      nanovdb::GridMetaData::activeVoxelCount((GridMetaData *)0x6596e1);
      Log<std::__cxx11::string_const&,unsigned_long,std::__cxx11::string_const&>
                (level,(char *)file,(int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff40),(unsigned_long *)args_1,
                 in_stack_ffffffffffffff70);
    }
  }
  NanoVDBBuffer::~NanoVDBBuffer((NanoVDBBuffer *)0x659751);
  return in_RDI;
}

Assistant:

static nanovdb::GridHandle<Buffer> readGrid(const std::string &filename,
                                            const std::string &gridName,
                                            const FileLoc *loc, Allocator alloc) {
    NanoVDBBuffer buf(alloc);
    nanovdb::GridHandle<Buffer> grid;
    try {
        grid =
            nanovdb::io::readGrid<Buffer>(filename, gridName, 0 /* not verbose */, buf);
    } catch (const std::exception &e) {
        ErrorExit("nanovdb: %s: %s", filename, e.what());
    }

    if (grid) {
        if (!grid.gridMetaData()->isFogVolume() && !grid.gridMetaData()->isUnknown())
            ErrorExit(loc, "%s: \"%s\" isn't a FogVolume grid?", filename, gridName);

        LOG_VERBOSE("%s: found %d \"%s\" voxels", filename,
                    grid.gridMetaData()->activeVoxelCount(), gridName);
    }

    return grid;
}